

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O0

FilePath * __thiscall testing::internal::FilePath::RemoveTrailingPathSeparator(FilePath *this)

{
  bool bVar1;
  FilePath *in_RSI;
  string *in_RDI;
  FilePath *in_stack_ffffffffffffff98;
  string *pathname;
  string local_30 [48];
  
  pathname = in_RDI;
  bVar1 = IsDirectory(in_RSI);
  if (bVar1) {
    std::__cxx11::string::length();
    std::__cxx11::string::substr((ulong)local_30,(ulong)in_RSI);
    FilePath(in_RSI,pathname);
    std::__cxx11::string::~string(local_30);
  }
  else {
    FilePath((FilePath *)in_RDI,in_stack_ffffffffffffff98);
  }
  return (FilePath *)pathname;
}

Assistant:

FilePath FilePath::RemoveTrailingPathSeparator() const {
  return IsDirectory() ? FilePath(pathname_.substr(0, pathname_.length() - 1))
                       : *this;
}